

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O0

void __thiscall
ktx::Reporter::fatal<char_const(&)[67]>(Reporter *this,ReturnCode return_code,char (*args) [67])

{
  undefined8 uVar1;
  undefined8 in_RDX;
  FatalError *in_RDI;
  ReturnCode in_stack_fffffffffffffefc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  ostream *in_stack_ffffffffffffff30;
  basic_string_view<char> in_stack_ffffffffffffff38;
  undefined8 local_b0;
  size_t local_a8;
  char *local_a0;
  size_t local_98;
  undefined8 local_90;
  char *local_78;
  char **local_70;
  char *local_68;
  char **local_60;
  char *local_58;
  undefined1 *local_50;
  char *local_48;
  undefined1 *local_40;
  char *local_38;
  char *local_30;
  undefined8 local_28;
  undefined8 *local_20;
  undefined8 local_18;
  undefined8 *local_10;
  undefined8 local_8;
  
  local_70 = &local_a0;
  local_78 = "{} fatal: ";
  local_68 = "{} fatal: ";
  local_a0 = "{} fatal: ";
  local_90 = in_RDX;
  local_60 = local_70;
  local_98 = std::char_traits<char>::length((char_type *)0x2afd99);
  local_38 = local_78;
  ::fmt::v10::print<std::__cxx11::string&>
            (in_stack_ffffffffffffff30,
             (format_string<std::__cxx11::basic_string<char>_&>)in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff28);
  local_20 = &local_b0;
  local_28 = local_90;
  local_18 = local_90;
  local_b0 = local_90;
  local_10 = local_20;
  local_a8 = std::char_traits<char>::length((char_type *)0x2afe34);
  local_8 = local_28;
  ::fmt::v10::print<>(in_stack_ffffffffffffff30,(format_string<>)in_stack_ffffffffffffff38);
  local_50 = &stack0xffffffffffffff40;
  local_58 = "\n";
  local_48 = "\n";
  local_40 = local_50;
  std::char_traits<char>::length((char_type *)0x2afec5);
  local_30 = local_58;
  ::fmt::v10::print<>(in_stack_ffffffffffffff30,(format_string<>)in_stack_ffffffffffffff38);
  uVar1 = __cxa_allocate_exception(0x10);
  FatalError::FatalError(in_RDI,in_stack_fffffffffffffefc);
  __cxa_throw(uVar1,&FatalError::typeinfo,FatalError::~FatalError);
}

Assistant:

void fatal(ReturnCode return_code, Args&&... args) {
        fmt::print(std::cerr, "{} fatal: ", commandName);
        fmt::print(std::cerr, std::forward<Args>(args)...);
        fmt::print(std::cerr, "\n");
        throw FatalError(return_code);
    }